

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

bool __thiscall
S2Builder::EdgeChainSimplifier::TargetInputVertices
          (EdgeChainSimplifier *this,VertexId v,S2PolylineSimplifier *simplifier)

{
  bool bVar1;
  compact_array_base<int,_std::allocator<int>_> *this_00;
  const_iterator pvVar2;
  const_reference p;
  InputVertexId i;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  S2PolylineSimplifier *simplifier_local;
  VertexId v_local;
  EdgeChainSimplifier *this_local;
  
  this_00 = &std::
             vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
             ::operator[](this->site_vertices_,(long)v)->
             super_compact_array_base<int,_std::allocator<int>_>;
  __end1 = gtl::compact_array_base<int,_std::allocator<int>_>::begin(this_00);
  pvVar2 = gtl::compact_array_base<int,_std::allocator<int>_>::end(this_00);
  while( true ) {
    if (__end1 == pvVar2) {
      return true;
    }
    p = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                  (&this->builder_->input_vertices_,(long)*__end1);
    bVar1 = S2PolylineSimplifier::TargetDisc
                      (simplifier,p,(S1ChordAngle)(this->builder_->edge_snap_radius_ca_).length2_);
    if (!bVar1) break;
    __end1 = __end1 + 1;
  }
  return false;
}

Assistant:

bool S2Builder::EdgeChainSimplifier::TargetInputVertices(
    VertexId v, S2PolylineSimplifier* simplifier) const {
  for (InputVertexId i : site_vertices_[v]) {
    if (!simplifier->TargetDisc(builder_.input_vertices_[i],
                                builder_.edge_snap_radius_ca_)) {
      return false;
    }
  }
  return true;
}